

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstrumentMemory.cpp
# Opt level: O2

void __thiscall wasm::InstrumentMemory::visitStructSet(InstrumentMemory *this,StructSet *curr)

{
  Index x;
  uintptr_t uVar1;
  size_t sVar2;
  char *pcVar3;
  Call *pCVar4;
  initializer_list<wasm::Expression_*> __l;
  Name target;
  Const *local_68;
  Expression *local_60;
  _Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_58;
  Builder local_40;
  Builder builder;
  
  local_40.wasm =
       (this->
       super_WalkerPass<wasm::PostWalker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>_>
       ).super_PostWalker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>.
       super_Walker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>.currModule
  ;
  uVar1 = (curr->value->type).id;
  if (uVar1 - 2 < 4) {
    sVar2 = *(size_t *)(&PTR_DAT_00e1f090)[uVar1];
    pcVar3 = *(char **)(&PTR_struct_get_val_f32_00e1f070)[uVar1];
    x = this->id;
    this->id = x + 1;
    local_68 = Builder::makeConst<int>(&local_40,x);
    local_60 = curr->value;
    __l._M_len = 2;
    __l._M_array = (iterator)&local_68;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&local_58,__l,
               (allocator_type *)((long)&builder.wasm + 7));
    target.super_IString.str._M_str = pcVar3;
    target.super_IString.str._M_len = sVar2;
    pCVar4 = Builder::makeCall(&local_40,target,
                               (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                               &local_58,(Type)(curr->value->type).id,false);
    curr->value = (Expression *)pCVar4;
    std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
              (&local_58);
  }
  return;
}

Assistant:

void visitStructSet(StructSet* curr) {
    Builder builder(*getModule());
    Name target;
    if (curr->value->type == Type::i32) {
      target = struct_set_val_i32;
    } else if (curr->value->type == Type::i64) {
      target = struct_set_val_i64;
    } else if (curr->value->type == Type::f32) {
      target = struct_set_val_f32;
    } else if (curr->value->type == Type::f64) {
      target = struct_set_val_f64;
    } else {
      return; // TODO: other types, unreachable, etc.
    }
    curr->value =
      builder.makeCall(target,
                       {builder.makeConst(int32_t(id++)), curr->value},
                       curr->value->type);
  }